

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpp_api.c
# Opt level: O2

MPP_RET dci_hist_info_parser(RK_U8 *p_pack_hist_addr,RK_U32 *p_hist_local,RK_U32 *p_hist_global)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  MPP_RET MVar7;
  ushort *puVar8;
  ulong uVar9;
  long lVar10;
  
  if (p_hist_global == (RK_U32 *)0x0 ||
      (p_hist_local == (RK_U32 *)0x0 || p_pack_hist_addr == (RK_U8 *)0x0)) {
    _mpp_log_l(2,0,"found NULL ptr, pack_hist %p hist_local %p hist_global %p\n",
               "dci_hist_info_parser",p_pack_hist_addr,p_hist_local,p_hist_global);
    MVar7 = MPP_ERR_NULL_PTR;
  }
  else {
    puVar8 = (ushort *)(p_pack_hist_addr + 7);
    for (uVar9 = 0; uVar9 < 0x1000; uVar9 = uVar9 + 4) {
      bVar1 = *(byte *)((long)puVar8 + -5);
      uVar5 = puVar8[-2];
      bVar2 = *(byte *)((long)puVar8 + -3);
      uVar6 = puVar8[-1];
      bVar3 = *(byte *)((long)puVar8 + -1);
      uVar4 = *puVar8;
      p_hist_local[uVar9] =
           (uint)(byte)puVar8[-3] << 8 | (bVar1 & 3) << 0x10 | (uint)*(byte *)((long)puVar8 + -7);
      p_hist_local[uVar9 + 1] = (uint)(bVar1 >> 2) | (uint)(byte)uVar5 << 6 | (bVar2 & 0xf) << 0xe;
      p_hist_local[uVar9 + 2] = (uint)(bVar2 >> 4) | (uint)(byte)uVar6 << 4 | (bVar3 & 0x3f) << 0xc;
      p_hist_local[uVar9 + 3] = (uint)(bVar3 >> 6) + (uint)uVar4 * 4;
      puVar8 = (ushort *)((long)puVar8 + 9);
    }
    MVar7 = MPP_OK;
    for (lVar10 = 0; lVar10 != 0x100; lVar10 = lVar10 + 1) {
      p_hist_global[lVar10] = *(RK_U32 *)(p_pack_hist_addr + lVar10 * 4 + 0x2400);
    }
  }
  return MVar7;
}

Assistant:

MPP_RET dci_hist_info_parser(RK_U8* p_pack_hist_addr, RK_U32* p_hist_local, RK_U32* p_hist_global)
{
    RK_U32 hw_hist_idx = 0;
    RK_U32 idx;

    if (NULL == p_pack_hist_addr || NULL == p_hist_local || NULL == p_hist_global) {
        mpp_err_f("found NULL ptr, pack_hist %p hist_local %p hist_global %p\n",  p_pack_hist_addr, p_hist_local, p_hist_global);
        return MPP_ERR_NULL_PTR;
    }

    /* Hist packed (10240 byte) -> unpacked (local: 16 * 16 * 16 * U32 + global: 256 * U32) */
    for (idx = 0; idx < RKVOP_PQ_PREPROCESS_HIST_SIZE_VERI * RKVOP_PQ_PREPROCESS_HIST_SIZE_HORI * RKVOP_PQ_PREPROCESS_LOCAL_HIST_BIN_NUMS; idx = idx + 4) {
        RK_U32 tmp0_u18, tmp1_u18, tmp2_u18, tmp3_u18;
        RK_U32 tmp0_u8, tmp1_u8, tmp2_u8, tmp3_u8, tmp4_u8, tmp5_u8, tmp6_u8, tmp7_u8, tmp8_u8;

        tmp0_u8 = *(p_pack_hist_addr + hw_hist_idx + 0);
        tmp1_u8 = *(p_pack_hist_addr + hw_hist_idx + 1);
        tmp2_u8 = *(p_pack_hist_addr + hw_hist_idx + 2);
        tmp3_u8 = *(p_pack_hist_addr + hw_hist_idx + 3);
        tmp4_u8 = *(p_pack_hist_addr + hw_hist_idx + 4);
        tmp5_u8 = *(p_pack_hist_addr + hw_hist_idx + 5);
        tmp6_u8 = *(p_pack_hist_addr + hw_hist_idx + 6);
        tmp7_u8 = *(p_pack_hist_addr + hw_hist_idx + 7);
        tmp8_u8 = *(p_pack_hist_addr + hw_hist_idx + 8);

        tmp0_u18 = ((tmp2_u8 & ((1 << 2) - 1)) << 16) + (tmp1_u8 << 8) + tmp0_u8;
        tmp1_u18 = ((tmp4_u8 & ((1 << 4) - 1)) << 14) + (tmp3_u8 << 6) + (tmp2_u8 >> 2);
        tmp2_u18 = ((tmp6_u8 & ((1 << 6) - 1)) << 12) + (tmp5_u8 << 4) + (tmp4_u8 >> 4);
        tmp3_u18 = (tmp8_u8 << 10) + (tmp7_u8 << 2) + (tmp6_u8 >> 6);

        *(p_hist_local + idx + 0) = tmp0_u18;
        *(p_hist_local + idx + 1) = tmp1_u18;
        *(p_hist_local + idx + 2) = tmp2_u18;
        *(p_hist_local + idx + 3) = tmp3_u18;
        hw_hist_idx += 9;
    }

    for (idx = 0; idx < RKVOP_PQ_PREPROCESS_GLOBAL_HIST_BIN_NUMS; idx++) {
        RK_U32 tmp0_u8, tmp1_u8, tmp2_u8, tmp3_u8;
        RK_U32 tmp_u32;

        tmp0_u8 = *(p_pack_hist_addr + hw_hist_idx + 0);
        tmp1_u8 = *(p_pack_hist_addr + hw_hist_idx + 1);
        tmp2_u8 = *(p_pack_hist_addr + hw_hist_idx + 2);
        tmp3_u8 = *(p_pack_hist_addr + hw_hist_idx + 3);

        tmp_u32 = (tmp3_u8 << 24) + (tmp2_u8 << 16) + (tmp1_u8 << 8) + tmp0_u8;
        *(p_hist_global + idx + 0) = tmp_u32;
        hw_hist_idx += 4;
    }

    return MPP_OK;
}